

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon_sse42_intr.c
# Opt level: O0

void ihevc_itrans_recon_4x4_sse42
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong *puVar19;
  undefined4 *puVar20;
  undefined4 *in_RCX;
  ulong *in_RDX;
  ulong *in_RDI;
  int in_R8D;
  int in_R9D;
  int iVar21;
  int iVar29;
  int iVar31;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar22;
  int iVar30;
  int iVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i m_temp_reg_30;
  __m128i m_temp_reg_25;
  __m128i m_temp_reg_24;
  __m128i m_temp_reg_23;
  __m128i m_temp_reg_22;
  __m128i m_temp_reg_21;
  __m128i m_temp_reg_20;
  __m128i m_temp_reg_15;
  __m128i m_temp_reg_14;
  __m128i m_temp_reg_13;
  __m128i m_temp_reg_12;
  __m128i m_temp_reg_11;
  __m128i m_temp_reg_10;
  __m128i m_temp_reg_3;
  __m128i m_temp_reg_2;
  __m128i m_temp_reg_1;
  __m128i m_temp_reg_0;
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined4 local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined4 local_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined8 local_568;
  undefined8 local_528;
  undefined4 uStack_4a4;
  undefined4 uStack_494;
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined4 uStack_1bc;
  undefined4 uStack_1ac;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined4 local_e8;
  undefined4 local_c8;
  UWORD32 *pu4_dst;
  undefined4 uStack_78;
  WORD32 i4_shift;
  __m128i m_count;
  __m128i m_rdng_factor;
  __m128i m_coeff3;
  __m128i m_coeff1;
  __m128i m_temp_reg_34;
  __m128i m_temp_reg_33;
  __m128i m_temp_reg_31;
  
  local_ab8._8_8_ = 0;
  local_ab8._0_8_ = *in_RDI;
  puVar19 = (ulong *)((long)in_RDI + (long)in_R8D * 2);
  local_ac8._0_8_ = *puVar19;
  local_ac8._8_8_ = 0;
  puVar19 = (ulong *)((long)puVar19 + (long)in_R8D * 2);
  local_ad8._0_8_ = *puVar19;
  local_ad8._8_8_ = 0;
  local_ae8._0_8_ = *(ulong *)((long)puVar19 + (long)in_R8D * 2);
  local_ae8._8_8_ = 0;
  auVar23 = pmovsxwd(local_ab8,*in_RDI);
  auVar24 = pmovsxwd(local_ad8,local_ad8._0_8_);
  auVar25 = pmovsxwd(local_ac8,local_ac8._0_8_);
  auVar26 = pmovsxwd(local_ae8,local_ae8._0_8_);
  m_temp_reg_33[1]._0_4_ = auVar23._0_4_;
  m_temp_reg_33[1]._4_4_ = auVar23._4_4_;
  m_temp_reg_31[0]._0_4_ = auVar23._8_4_;
  m_temp_reg_31[0]._4_4_ = auVar23._12_4_;
  m_coeff1[1]._0_4_ = auVar24._0_4_;
  m_coeff1[1]._4_4_ = auVar24._4_4_;
  m_temp_reg_34[0]._0_4_ = auVar24._8_4_;
  m_temp_reg_34[0]._4_4_ = auVar24._12_4_;
  auVar2._8_4_ = 0x24;
  auVar2._12_4_ = 0x24;
  auVar2._0_4_ = 0x24;
  auVar2._4_4_ = 0x24;
  auVar23 = pmulld(auVar25,auVar2);
  auVar1._8_4_ = 0x53;
  auVar1._12_4_ = 0x53;
  auVar1._0_4_ = 0x53;
  auVar1._4_4_ = 0x53;
  auVar24 = pmulld(auVar26,auVar1);
  auVar28._8_4_ = 0x53;
  auVar28._12_4_ = 0x53;
  auVar28._0_4_ = 0x53;
  auVar28._4_4_ = 0x53;
  auVar25 = pmulld(auVar25,auVar28);
  auVar27._8_4_ = 0x24;
  auVar27._12_4_ = 0x24;
  auVar27._0_4_ = 0x24;
  auVar27._4_4_ = 0x24;
  auVar26 = pmulld(auVar26,auVar27);
  local_528 = SUB168(ZEXT416(7),0);
  local_818 = auVar23._0_4_;
  uStack_814 = auVar23._4_4_;
  uStack_810 = auVar23._8_4_;
  uStack_80c = auVar23._12_4_;
  local_828 = auVar24._0_4_;
  uStack_824 = auVar24._4_4_;
  uStack_820 = auVar24._8_4_;
  uStack_81c = auVar24._12_4_;
  iVar21 = (int)m_temp_reg_33[1] * 0x40 + (int)m_coeff1[1] * -0x40 + 0x40;
  iVar29 = (m_temp_reg_33[1]._4_4_ - m_coeff1[1]._4_4_) + 0x40;
  iVar31 = ((int)m_temp_reg_31[0] - (int)m_temp_reg_34[0]) + 0x40;
  iVar33 = (m_temp_reg_31[0]._4_4_ - m_temp_reg_34[0]._4_4_) + 0x40;
  iVar22 = (int)m_temp_reg_33[1] * 0x40 + (int)m_coeff1[1] * 0x40 + 0x40;
  iVar30 = m_temp_reg_33[1]._4_4_ + m_coeff1[1]._4_4_ + 0x40;
  iVar32 = (int)m_temp_reg_31[0] + (int)m_temp_reg_34[0] + 0x40;
  iVar34 = m_temp_reg_31[0]._4_4_ + m_temp_reg_34[0]._4_4_ + 0x40;
  local_5d8 = auVar25._0_4_;
  uStack_5d4 = auVar25._4_4_;
  uStack_5d0 = auVar25._8_4_;
  uStack_5cc = auVar25._12_4_;
  local_5e8 = auVar26._0_4_;
  uStack_5e4 = auVar26._4_4_;
  uStack_5e0 = auVar26._8_4_;
  uStack_5dc = auVar26._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_528;
  local_b68._4_4_ = iVar29 + (uStack_814 - uStack_824) >> auVar10;
  local_b68._0_4_ = iVar21 + (local_818 - local_828) >> auVar10;
  local_b68._8_4_ = iVar31 + (uStack_810 - uStack_820) >> auVar10;
  local_b68._12_4_ = iVar33 + (uStack_80c - uStack_81c) >> auVar10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_528;
  local_b58._4_4_ = iVar30 + uStack_5d4 + uStack_5e4 >> auVar9;
  local_b58._0_4_ = iVar22 + local_5d8 + local_5e8 >> auVar9;
  local_b58._8_4_ = iVar32 + uStack_5d0 + uStack_5e0 >> auVar9;
  local_b58._12_4_ = iVar34 + uStack_5cc + uStack_5dc >> auVar9;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_528;
  local_b78._4_4_ = iVar29 - (uStack_814 - uStack_824) >> auVar8;
  local_b78._0_4_ = iVar21 - (local_818 - local_828) >> auVar8;
  local_b78._8_4_ = iVar31 - (uStack_810 - uStack_820) >> auVar8;
  local_b78._12_4_ = iVar33 - (uStack_80c - uStack_81c) >> auVar8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_528;
  local_b88._4_4_ = iVar30 - (uStack_5d4 + uStack_5e4) >> auVar7;
  local_b88._0_4_ = iVar22 - (local_5d8 + local_5e8) >> auVar7;
  local_b88._8_4_ = iVar32 - (uStack_5d0 + uStack_5e0) >> auVar7;
  local_b88._12_4_ = iVar34 - (uStack_5cc + uStack_5dc) >> auVar7;
  auVar18._8_8_ = local_b58._8_8_;
  auVar18._0_8_ = local_b58._0_8_;
  auVar17._8_8_ = local_b68._8_8_;
  auVar17._0_8_ = local_b68._0_8_;
  auVar23 = packssdw(auVar18,auVar17);
  auVar16._8_8_ = local_b78._8_8_;
  auVar16._0_8_ = local_b78._0_8_;
  auVar15._8_8_ = local_b88._8_8_;
  auVar15._0_8_ = local_b88._0_8_;
  auVar24 = packssdw(auVar16,auVar15);
  local_1f8 = auVar23._0_2_;
  uStack_1f6 = auVar23._2_2_;
  uStack_1f4 = auVar23._4_2_;
  uStack_1f2 = auVar23._6_2_;
  local_208 = auVar23._8_2_;
  uStack_206 = auVar23._10_2_;
  uStack_204 = auVar23._12_2_;
  uStack_202 = auVar23._14_2_;
  local_218 = auVar24._0_2_;
  uStack_216 = auVar24._2_2_;
  uStack_214 = auVar24._4_2_;
  uStack_212 = auVar24._6_2_;
  local_228 = auVar24._8_2_;
  uStack_226 = auVar24._10_2_;
  uStack_224 = auVar24._12_2_;
  uStack_222 = auVar24._14_2_;
  uStack_494 = (undefined4)
               (CONCAT26(uStack_206,CONCAT24(uStack_1f6,CONCAT22(local_208,local_1f8))) >> 0x20);
  uStack_4a4 = (undefined4)
               (CONCAT26(uStack_226,CONCAT24(uStack_216,CONCAT22(local_228,local_218))) >> 0x20);
  local_b58._4_4_ = CONCAT22(local_228,local_218);
  local_b58._0_4_ = CONCAT22(local_208,local_1f8);
  local_b58._8_4_ = uStack_494;
  local_b58._12_4_ = uStack_4a4;
  uStack_1ac = (undefined4)
               (CONCAT26(uStack_202,CONCAT24(uStack_1f2,CONCAT22(uStack_204,uStack_1f4))) >> 0x20);
  uStack_1bc = (undefined4)
               (CONCAT26(uStack_222,CONCAT24(uStack_212,CONCAT22(uStack_224,uStack_214))) >> 0x20);
  local_b68._4_4_ = CONCAT22(uStack_224,uStack_214);
  local_b68._0_4_ = CONCAT22(uStack_204,uStack_1f4);
  local_b68._8_4_ = uStack_1ac;
  local_b68._12_4_ = uStack_1bc;
  local_b78._8_8_ = 0;
  local_b78._0_8_ = local_b58._8_8_;
  local_b88._8_8_ = 0;
  local_b88._0_8_ = local_b68._8_8_;
  auVar23 = pmovsxwd(local_b58,local_b58._0_8_);
  auVar27 = pmovsxwd(local_b68,local_b68._0_8_);
  auVar24 = pmovsxwd(local_b78,local_b58._8_8_);
  auVar28 = pmovsxwd(local_b88,local_b68._8_8_);
  m_rdng_factor[1]._0_4_ = auVar23._0_4_;
  m_rdng_factor[1]._4_4_ = auVar23._4_4_;
  m_coeff3[0]._0_4_ = auVar23._8_4_;
  m_coeff3[0]._4_4_ = auVar23._12_4_;
  auVar26._8_4_ = 0x24;
  auVar26._12_4_ = 0x24;
  auVar26._0_4_ = 0x24;
  auVar26._4_4_ = 0x24;
  auVar26 = pmulld(auVar24,auVar26);
  auVar25._8_4_ = 0x53;
  auVar25._12_4_ = 0x53;
  auVar25._0_4_ = 0x53;
  auVar25._4_4_ = 0x53;
  auVar25 = pmulld(auVar24,auVar25);
  auVar24._8_4_ = 0x53;
  auVar24._12_4_ = 0x53;
  auVar24._0_4_ = 0x53;
  auVar24._4_4_ = 0x53;
  auVar24 = pmulld(auVar28,auVar24);
  auVar23._8_4_ = 0x24;
  auVar23._12_4_ = 0x24;
  auVar23._0_4_ = 0x24;
  auVar23._4_4_ = 0x24;
  auVar23 = pmulld(auVar28,auVar23);
  uStack_78 = auVar27._0_4_;
  i4_shift = auVar27._4_4_;
  m_count[0]._0_4_ = auVar27._8_4_;
  m_count[0]._4_4_ = auVar27._12_4_;
  local_568 = SUB168(ZEXT416(0xc),0);
  local_898 = auVar26._0_4_;
  uStack_894 = auVar26._4_4_;
  uStack_890 = auVar26._8_4_;
  uStack_88c = auVar26._12_4_;
  local_8a8 = auVar24._0_4_;
  uStack_8a4 = auVar24._4_4_;
  uStack_8a0 = auVar24._8_4_;
  uStack_89c = auVar24._12_4_;
  iVar21 = (int)m_rdng_factor[1] * 0x40 + uStack_78 * -0x40 + 0x800;
  iVar29 = (m_rdng_factor[1]._4_4_ - i4_shift) + 0x800;
  iVar31 = ((int)m_coeff3[0] - (int)m_count[0]) + 0x800;
  iVar33 = (m_coeff3[0]._4_4_ - m_count[0]._4_4_) + 0x800;
  iVar22 = (int)m_rdng_factor[1] * 0x40 + uStack_78 * 0x40 + 0x800;
  iVar30 = m_rdng_factor[1]._4_4_ + i4_shift + 0x800;
  iVar32 = (int)m_coeff3[0] + (int)m_count[0] + 0x800;
  iVar34 = m_coeff3[0]._4_4_ + m_count[0]._4_4_ + 0x800;
  local_698 = auVar25._0_4_;
  uStack_694 = auVar25._4_4_;
  uStack_690 = auVar25._8_4_;
  uStack_68c = auVar25._12_4_;
  local_6a8 = auVar23._0_4_;
  uStack_6a4 = auVar23._4_4_;
  uStack_6a0 = auVar23._8_4_;
  uStack_69c = auVar23._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_568;
  local_b68._4_4_ = iVar29 + (uStack_894 - uStack_8a4) >> auVar6;
  local_b68._0_4_ = iVar21 + (local_898 - local_8a8) >> auVar6;
  local_b68._8_4_ = iVar31 + (uStack_890 - uStack_8a0) >> auVar6;
  local_b68._12_4_ = iVar33 + (uStack_88c - uStack_89c) >> auVar6;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_568;
  local_b78._4_4_ = iVar29 - (uStack_894 - uStack_8a4) >> auVar5;
  local_b78._0_4_ = iVar21 - (local_898 - local_8a8) >> auVar5;
  local_b78._8_4_ = iVar31 - (uStack_890 - uStack_8a0) >> auVar5;
  local_b78._12_4_ = iVar33 - (uStack_88c - uStack_89c) >> auVar5;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_568;
  local_b58._4_4_ = iVar30 + uStack_694 + uStack_6a4 >> auVar4;
  local_b58._0_4_ = iVar22 + local_698 + local_6a8 >> auVar4;
  local_b58._8_4_ = iVar32 + uStack_690 + uStack_6a0 >> auVar4;
  local_b58._12_4_ = iVar34 + uStack_68c + uStack_69c >> auVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_568;
  local_b88._4_4_ = iVar30 - (uStack_694 + uStack_6a4) >> auVar3;
  local_b88._0_4_ = iVar22 - (local_698 + local_6a8) >> auVar3;
  local_b88._8_4_ = iVar32 - (uStack_690 + uStack_6a0) >> auVar3;
  local_b88._12_4_ = iVar34 - (uStack_68c + uStack_69c) >> auVar3;
  auVar14._8_8_ = local_b58._8_8_;
  auVar14._0_8_ = local_b58._0_8_;
  auVar13._8_8_ = local_b68._8_8_;
  auVar13._0_8_ = local_b68._0_8_;
  auVar23 = packssdw(auVar14,auVar13);
  auVar12._8_8_ = local_b78._8_8_;
  auVar12._0_8_ = local_b78._0_8_;
  auVar11._8_8_ = local_b88._8_8_;
  auVar11._0_8_ = local_b88._0_8_;
  auVar24 = packssdw(auVar12,auVar11);
  local_238 = auVar23._0_2_;
  uStack_236 = auVar23._2_2_;
  uStack_234 = auVar23._4_2_;
  uStack_232 = auVar23._6_2_;
  local_248 = auVar23._8_2_;
  uStack_246 = auVar23._10_2_;
  uStack_244 = auVar23._12_2_;
  uStack_242 = auVar23._14_2_;
  local_258 = auVar24._0_2_;
  uStack_256 = auVar24._2_2_;
  uStack_254 = auVar24._4_2_;
  uStack_252 = auVar24._6_2_;
  local_268 = auVar24._8_2_;
  uStack_266 = auVar24._10_2_;
  uStack_264 = auVar24._12_2_;
  uStack_262 = auVar24._14_2_;
  local_ab8._8_8_ = 0;
  local_ab8._0_8_ = *in_RDX;
  local_ac8._0_8_ = *(ulong *)((long)in_RDX + (long)in_R9D);
  local_ac8._8_8_ = 0;
  puVar19 = (ulong *)((long)in_RDX + (long)in_R9D + (long)in_R9D);
  local_ad8._0_8_ = *puVar19;
  local_ad8._8_8_ = 0;
  local_ae8._0_8_ = *(ulong *)((long)puVar19 + (long)in_R9D);
  local_ae8._8_8_ = 0;
  auVar23 = pmovzxbw(local_ab8,*in_RDX);
  auVar24 = pmovzxbw(local_ac8,local_ac8._0_8_);
  auVar25 = pmovzxbw(local_ad8,local_ad8._0_8_);
  auVar26 = pmovzxbw(local_ae8,local_ae8._0_8_);
  local_148 = auVar23._0_2_;
  uStack_146 = auVar23._2_2_;
  uStack_144 = auVar23._4_2_;
  uStack_142 = auVar23._6_2_;
  uStack_140 = auVar24._0_2_;
  uStack_13e = auVar24._2_2_;
  uStack_13c = auVar24._4_2_;
  uStack_13a = auVar24._6_2_;
  local_238 = local_238 + local_148;
  local_248 = local_248 + uStack_146;
  local_258 = local_258 + uStack_144;
  local_268 = local_268 + uStack_142;
  uStack_236 = uStack_236 + uStack_140;
  uStack_246 = uStack_246 + uStack_13e;
  uStack_256 = uStack_256 + uStack_13c;
  uStack_266 = uStack_266 + uStack_13a;
  local_168 = auVar25._0_2_;
  uStack_166 = auVar25._2_2_;
  uStack_164 = auVar25._4_2_;
  uStack_162 = auVar25._6_2_;
  uStack_160 = auVar26._0_2_;
  uStack_15e = auVar26._2_2_;
  uStack_15c = auVar26._4_2_;
  uStack_15a = auVar26._6_2_;
  uStack_234 = uStack_234 + local_168;
  uStack_244 = uStack_244 + uStack_166;
  uStack_254 = uStack_254 + uStack_164;
  uStack_264 = uStack_264 + uStack_162;
  uStack_232 = uStack_232 + uStack_160;
  uStack_242 = uStack_242 + uStack_15e;
  uStack_252 = uStack_252 + uStack_15c;
  uStack_262 = uStack_262 + uStack_15a;
  local_ab8[1] = (0 < local_248) * (local_248 < 0x100) * (char)local_248 - (0xff < local_248);
  local_ab8[0] = (0 < local_238) * (local_238 < 0x100) * (char)local_238 - (0xff < local_238);
  local_ab8[2] = (0 < local_258) * (local_258 < 0x100) * (char)local_258 - (0xff < local_258);
  local_ab8[3] = (0 < local_268) * (local_268 < 0x100) * (char)local_268 - (0xff < local_268);
  local_ab8[4] = (0 < uStack_236) * (uStack_236 < 0x100) * (char)uStack_236 - (0xff < uStack_236);
  local_ab8[5] = (0 < uStack_246) * (uStack_246 < 0x100) * (char)uStack_246 - (0xff < uStack_246);
  local_ab8[6] = (0 < uStack_256) * (uStack_256 < 0x100) * (char)uStack_256 - (0xff < uStack_256);
  local_ab8[7] = (0 < uStack_266) * (uStack_266 < 0x100) * (char)uStack_266 - (0xff < uStack_266);
  local_ab8[8] = (0 < uStack_234) * (uStack_234 < 0x100) * (char)uStack_234 - (0xff < uStack_234);
  local_ab8[9] = (0 < uStack_244) * (uStack_244 < 0x100) * (char)uStack_244 - (0xff < uStack_244);
  local_ab8[10] = (0 < uStack_254) * (uStack_254 < 0x100) * (char)uStack_254 - (0xff < uStack_254);
  local_ab8[0xb] = (0 < uStack_264) * (uStack_264 < 0x100) * (char)uStack_264 - (0xff < uStack_264);
  local_ab8[0xc] = (0 < uStack_232) * (uStack_232 < 0x100) * (char)uStack_232 - (0xff < uStack_232);
  local_ab8[0xd] = (0 < uStack_242) * (uStack_242 < 0x100) * (char)uStack_242 - (0xff < uStack_242);
  local_ab8[0xe] = (0 < uStack_252) * (uStack_252 < 0x100) * (char)uStack_252 - (0xff < uStack_252);
  local_ab8[0xf] = (0 < uStack_262) * (uStack_262 < 0x100) * (char)uStack_262 - (0xff < uStack_262);
  *in_RCX = local_ab8._0_4_;
  local_c8 = SUB84(local_ab8._0_8_,4);
  *(undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_30[1]) = local_c8;
  puVar20 = (undefined4 *)((long)in_RCX + (long)(int)m_temp_reg_30[1] + (long)(int)m_temp_reg_30[1])
  ;
  local_e8 = local_ab8._8_4_;
  *puVar20 = local_e8;
  *(int *)((long)puVar20 + (long)(int)m_temp_reg_30[1]) = local_ab8._12_4_;
  return;
}

Assistant:

void ihevc_itrans_recon_4x4_sse42(WORD16 *pi2_src,
                                  WORD16 *pi2_tmp,
                                  UWORD8 *pu1_pred,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 pred_strd,
                                  WORD32 dst_strd,
                                  WORD32 zero_cols,
                                  WORD32 zero_rows)
{


    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20;
    __m128i m_temp_reg_21;
    __m128i m_temp_reg_22;
    __m128i m_temp_reg_23;
    __m128i m_temp_reg_24;
    __m128i m_temp_reg_25;
    __m128i m_temp_reg_30;
    __m128i m_temp_reg_31;
    __m128i m_temp_reg_33;
    __m128i m_temp_reg_34;
    __m128i m_coeff1, m_coeff3;
    __m128i m_rdng_factor;
    __m128i m_count;


    WORD32 i4_shift = IT_SHIFT_STAGE_1;
    UNUSED(zero_rows);
    UNUSED(zero_cols);
    UNUSED(pi2_tmp);


    m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pi2_src);
    pi2_src += src_strd;
    m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pi2_src);

    m_temp_reg_0 = _mm_cvtepi16_epi32(m_temp_reg_0);
    m_temp_reg_2 = _mm_cvtepi16_epi32(m_temp_reg_2);

    m_temp_reg_1 = _mm_cvtepi16_epi32(m_temp_reg_1);
    m_temp_reg_3 = _mm_cvtepi16_epi32(m_temp_reg_3);


    m_coeff1 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype0[0][0]); //36
    m_coeff3 = _mm_loadu_si128((__m128i *)&g_ai4_ihevc_trans_4_ttype0[2][0]); //83

    /* e */
    {
        m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_0, 6);
        m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_2, 6);
    }

    /* o */
    {
        m_temp_reg_12 = _mm_mullo_epi32(m_temp_reg_1, m_coeff1); //src[1]*36
        m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_3, m_coeff3); //src[3]*83
        m_temp_reg_14 = _mm_mullo_epi32(m_temp_reg_1, m_coeff3); //src[1]*83
        m_temp_reg_15 = _mm_mullo_epi32(m_temp_reg_3, m_coeff1); //src[3]*36
    }

    m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

    /* e1 stored in m_temp_reg_31 */
    {
        m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_11);
    }

    m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

    /* e0 stored in m_temp_reg_30 */
    {
        m_temp_reg_30 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
    }

    m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
    m_count = _mm_cvtsi32_si128(i4_shift);

    /* o1 stored in m_temp_reg_33 */
    {
        m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_12, m_temp_reg_13);
    }

    /* e1 + add */
    {
        m_temp_reg_31 = _mm_add_epi32(m_temp_reg_31, m_rdng_factor);
    }

    /* e0 + add */
    {
        m_temp_reg_30 = _mm_add_epi32(m_temp_reg_30, m_rdng_factor);
    }

    /* o0 stored in m_temp_reg_34 */
    {
        m_temp_reg_34 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_15);
    }

    /* Stage 1 outputs */
    {
        m_temp_reg_21 = _mm_add_epi32(m_temp_reg_31, m_temp_reg_33);
        m_temp_reg_22 = _mm_sub_epi32(m_temp_reg_31, m_temp_reg_33);

        m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_34);
        m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_30, m_temp_reg_34);


        m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
        m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
        m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);
        m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);

        m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
        m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
        m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

        m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
        m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
    }

    /* Stage 2 */
    {
        i4_shift = IT_SHIFT_STAGE_2;

        m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
        m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

        m_temp_reg_20 = _mm_cvtepi16_epi32(m_temp_reg_20);
        m_temp_reg_21 = _mm_cvtepi16_epi32(m_temp_reg_21);

        m_temp_reg_22 = _mm_cvtepi16_epi32(m_temp_reg_22);
        m_temp_reg_23 = _mm_cvtepi16_epi32(m_temp_reg_23);

        /* e */
        {
            m_temp_reg_10 = _mm_slli_epi32(m_temp_reg_20, 6);
        }

        /* o */
        {
            m_temp_reg_12 = _mm_mullo_epi32(m_temp_reg_22, m_coeff1); //src[1]*36
            m_temp_reg_14 = _mm_mullo_epi32(m_temp_reg_22, m_coeff3); //src[1]*83
            m_temp_reg_13 = _mm_mullo_epi32(m_temp_reg_23, m_coeff3); //src[3]*83
            m_temp_reg_15 = _mm_mullo_epi32(m_temp_reg_23, m_coeff1); //src[3]*36
        }

        /* e */
        {
            m_temp_reg_11 = _mm_slli_epi32(m_temp_reg_21, 6);
        }

        m_rdng_factor = _mm_cvtsi32_si128((1 << (i4_shift - 1)));

        /* e1 stored in m_temp_reg_31 */
        {
            m_temp_reg_31 = _mm_sub_epi32(m_temp_reg_10, m_temp_reg_11);
        }

        m_rdng_factor = _mm_unpacklo_epi32(m_rdng_factor, m_rdng_factor);

        /* e0 stored in m_temp_reg_30 */
        {
            m_temp_reg_30 = _mm_add_epi32(m_temp_reg_10, m_temp_reg_11);
        }

        m_rdng_factor = _mm_unpacklo_epi64(m_rdng_factor, m_rdng_factor);
        m_count = _mm_cvtsi32_si128(i4_shift);

        /* o1 stored in m_temp_reg_33 */
        {
            m_temp_reg_33 = _mm_sub_epi32(m_temp_reg_12, m_temp_reg_13);
        }

        /* e1 + add */
        {
            m_temp_reg_31 = _mm_add_epi32(m_temp_reg_31, m_rdng_factor);
        }

        /* e0 + add */
        {
            m_temp_reg_30 = _mm_add_epi32(m_temp_reg_30, m_rdng_factor);
        }

        /* o0 stored in m_temp_reg_34 */
        {
            m_temp_reg_34 = _mm_add_epi32(m_temp_reg_14, m_temp_reg_15);
        }

        /* Stage 2 outputs */
        {
            m_temp_reg_21 = _mm_add_epi32(m_temp_reg_31, m_temp_reg_33);
            m_temp_reg_22 = _mm_sub_epi32(m_temp_reg_31, m_temp_reg_33);
            m_temp_reg_20 = _mm_add_epi32(m_temp_reg_30, m_temp_reg_34);
            m_temp_reg_23 = _mm_sub_epi32(m_temp_reg_30, m_temp_reg_34);

            m_temp_reg_21 = _mm_sra_epi32(m_temp_reg_21, m_count);
            m_temp_reg_22 = _mm_sra_epi32(m_temp_reg_22, m_count);
            m_temp_reg_20 = _mm_sra_epi32(m_temp_reg_20, m_count);
            m_temp_reg_23 = _mm_sra_epi32(m_temp_reg_23, m_count);

            m_temp_reg_20 = _mm_packs_epi32(m_temp_reg_20, m_temp_reg_21);
            m_temp_reg_21 = _mm_packs_epi32(m_temp_reg_22, m_temp_reg_23);
            m_temp_reg_22 = _mm_srli_si128(m_temp_reg_20, 8);
            m_temp_reg_23 = _mm_srli_si128(m_temp_reg_21, 8);

            m_temp_reg_24 = _mm_unpacklo_epi16(m_temp_reg_20, m_temp_reg_22);
            m_temp_reg_25 = _mm_unpacklo_epi16(m_temp_reg_21, m_temp_reg_23);

            m_temp_reg_20 = _mm_unpacklo_epi32(m_temp_reg_24, m_temp_reg_25);
            m_temp_reg_21 = _mm_unpackhi_epi32(m_temp_reg_24, m_temp_reg_25);
        }

        /* Recon and store */
        {
            UWORD32 *pu4_dst = (UWORD32 *)pu1_dst;

            m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_1 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_2 = _mm_loadl_epi64((__m128i *)pu1_pred);
            pu1_pred += pred_strd;
            m_temp_reg_3 = _mm_loadl_epi64((__m128i *)pu1_pred);

            m_temp_reg_0 = _mm_cvtepu8_epi16(m_temp_reg_0);
            m_temp_reg_1 = _mm_cvtepu8_epi16(m_temp_reg_1);
            m_temp_reg_0 = _mm_unpacklo_epi64(m_temp_reg_0, m_temp_reg_1);
            m_temp_reg_2 = _mm_cvtepu8_epi16(m_temp_reg_2);
            m_temp_reg_3 = _mm_cvtepu8_epi16(m_temp_reg_3);
            m_temp_reg_1 = _mm_unpacklo_epi64(m_temp_reg_2, m_temp_reg_3);

            m_temp_reg_20 = _mm_add_epi16(m_temp_reg_20, m_temp_reg_0);
            m_temp_reg_21 = _mm_add_epi16(m_temp_reg_21, m_temp_reg_1);

            m_temp_reg_0 = _mm_packus_epi16(m_temp_reg_20, m_temp_reg_21);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_0);
            m_temp_reg_1 = _mm_srli_si128(m_temp_reg_0, 4);
            m_temp_reg_2 = _mm_srli_si128(m_temp_reg_0, 8);
            m_temp_reg_3 = _mm_srli_si128(m_temp_reg_0, 12);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
            pu1_dst += dst_strd;
            pu4_dst = (UWORD32 *)(pu1_dst);

            *pu4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
        }
    }
}